

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

Own<kj::WebSocket> __thiscall
kj::Own<kj::WebSocket>::
attach<kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient>>
          (Own<kj::WebSocket> *this,
          Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient> *attachments)

{
  DisposableOwnedBundle<kj::Own<kj::WebSocket>,_kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient>_>
  *this_00;
  Own<kj::WebSocket> *values;
  Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient> *values_1;
  NoInfer<kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient>_> *in_RDX;
  WebSocket *extraout_RDX;
  Own<kj::WebSocket> OVar1;
  DisposableOwnedBundle<kj::Own<kj::WebSocket>,_kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient>_>
  *bundle;
  WebSocket *ptrCopy;
  Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient> *attachments_local;
  Own<kj::WebSocket> *this_local;
  
  bundle = (DisposableOwnedBundle<kj::Own<kj::WebSocket>,_kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient>_>
            *)attachments->ptr;
  if ((RefcountedClient *)bundle != (RefcountedClient *)0x0) {
    if ((RefcountedClient *)bundle == (RefcountedClient *)0x0) {
      bundle = (DisposableOwnedBundle<kj::Own<kj::WebSocket>,_kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient>_>
                *)0x1;
    }
    this_00 = (DisposableOwnedBundle<kj::Own<kj::WebSocket>,_kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient>_>
               *)operator_new(0x28);
    values = mv<kj::Own<kj::WebSocket>>((Own<kj::WebSocket> *)attachments);
    values_1 = fwd<kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient>>
                         (in_RDX);
    _::
    DisposableOwnedBundle<kj::Own<kj::WebSocket>,_kj::Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient>_>
    ::DisposableOwnedBundle(this_00,values,values_1);
    Own(this,(WebSocket *)bundle,(Disposer *)this_00);
    OVar1.ptr = extraout_RDX;
    OVar1.disposer = (Disposer *)this;
    return OVar1;
  }
  _::inlineRequireFailure
            ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/../kj/memory.h"
             ,0x1fe,"ptrCopy != nullptr","\"cannot attach to null pointer\"",
             "cannot attach to null pointer");
}

Assistant:

Own<T> Own<T>::attach(Attachments&&... attachments) {
  T* ptrCopy = ptr;

  KJ_IREQUIRE(ptrCopy != nullptr, "cannot attach to null pointer");

  // HACK: If someone accidentally calls .attach() on a null pointer in opt mode, try our best to
  //   accomplish reasonable behavior: We turn the pointer non-null but still invalid, so that the
  //   disposer will still be called when the pointer goes out of scope.
  if (ptrCopy == nullptr) ptrCopy = reinterpret_cast<T*>(1);

  auto bundle = new _::DisposableOwnedBundle<Own<T>, Attachments...>(
      kj::mv(*this), kj::fwd<Attachments>(attachments)...);
  return Own<T>(ptrCopy, *bundle);
}